

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chull.cpp
# Opt level: O0

void masc::polygon::hull2d
               (ply_vertex *s,ply_vertex *e,
               list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull
               )

{
  ply_vertex *ppVar1;
  bool bVar2;
  reference pppVar3;
  ply_vertex *local_38;
  ply_vertex *ptr;
  ply_vertex *local_28;
  ply_vertex *ne;
  list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull_local;
  ply_vertex *e_local;
  ply_vertex *s_local;
  
  ne = (ply_vertex *)hull;
  hull_local = (list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *)e;
  e_local = s;
  local_28 = next(e);
  std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::
  push_back((list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *)ne,
            &e_local);
  ppVar1 = ne;
  ptr = next(e_local);
  std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::
  push_back((list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *)
            ppVar1,&ptr);
  ppVar1 = ne;
  pppVar3 = std::__cxx11::
            list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::back
                      ((list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                        *)ne);
  std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::
  push_front((list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *)
             ppVar1,pppVar3);
  pppVar3 = std::__cxx11::
            list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::back
                      ((list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                        *)ne);
  for (local_38 = next(*pppVar3); local_38 != local_28; local_38 = next(local_38)) {
    bVar2 = inHull(local_38,(list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                             *)ne);
    if (!bVar2) {
      updateHullTop(local_38,(list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                              *)ne);
      updateHullBot(local_38,(list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                              *)ne);
      std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
      ::push_back((list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *
                  )ne,&local_38);
      std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
      ::push_front((list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                    *)ne,&local_38);
    }
  }
  std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::
  pop_back((list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *)ne);
  return;
}

Assistant:

void hull2d(ply_vertex * s, ply_vertex * e, list<ply_vertex*>& hull )
{
    //avoid letting s and e in the bridge
    //if( s->getBridge()!=NULL ) s=s->getBridge()->v2;
    //if( e->getBridge()!=NULL ) e=e->getBridge()->v1;
    ply_vertex * ne=next(e);

    //init the hull
    hull.push_back(s);
    hull.push_back(next(s));
    hull.push_front(hull.back());

    //incrementally create the hull
    ply_vertex * ptr=next(hull.back());
    while(ptr!=ne){

        //check if the ptr is contained in the hull
        if( !inHull(ptr,hull) ){
            updateHullTop(ptr,hull);
            updateHullBot(ptr,hull);
            hull.push_back(ptr);
            hull.push_front(ptr);
        }

        ptr=next(ptr);

    }//end while(ptr!=ne);
    
    hull.pop_back();
}